

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write_significand<fmt::v11::basic_appender<char>,char>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point)

{
  basic_appender<char> bVar1;
  size_t sVar2;
  ulong uVar3;
  
  bVar1 = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                    (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    sVar2 = (bVar1.container)->size_;
    uVar3 = sVar2 + 1;
    if ((bVar1.container)->capacity_ < uVar3) {
      (*(bVar1.container)->grow_)(bVar1.container,uVar3);
      sVar2 = (bVar1.container)->size_;
      uVar3 = sVar2 + 1;
    }
    (bVar1.container)->size_ = uVar3;
    (bVar1.container)->ptr_[sVar2] = decimal_point;
    bVar1 = copy_noinline<char,char_const*,fmt::v11::basic_appender<char>>
                      (significand + integral_size,significand + significand_size,bVar1);
    return (basic_appender<char>)bVar1.container;
  }
  return (basic_appender<char>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_noinline<Char>(significand, significand + integral_size,
                                    out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_noinline<Char>(significand + integral_size,
                                     significand + significand_size, out);
}